

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall
CDirectivePosition::CDirectivePosition(CDirectivePosition *this,Type type,ArgumentList *Args)

{
  bool bVar1;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CAssemblerCommand_00172a20;
  this->type = type;
  bVar1 = ConvertExpression(&((Args->entries).
                              super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_start)->text,&this->position);
  if (!bVar1) {
    Logger::printError<std::__cxx11::wstring>
              (FatalError,L"Invalid ram address %s",
               &((Args->entries).
                 super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_start)->text);
  }
  exec(this);
  Global.Section = Global.Section + 1;
  return;
}

Assistant:

CDirectivePosition::CDirectivePosition(Type type, ArgumentList& Args)
	: type(type)
{
	if (ConvertExpression(Args[0].text,position) == false)
	{
		Logger::printError(Logger::FatalError,L"Invalid ram address %s",Args[0].text);
	}
	
	exec();
	Global.Section++;
}